

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseElemExprVarListOpt(WastParser *this,ElemExprVector *out_list)

{
  bool bVar1;
  Location local_e8;
  Var local_c8;
  Location local_80;
  undefined1 local_60 [8];
  Var var;
  ElemExprVector *out_list_local;
  WastParser *this_local;
  
  var.field_2._24_8_ = out_list;
  Location::Location(&local_80);
  Var::Var((Var *)local_60,0xffffffff,&local_80);
  while( true ) {
    Location::Location(&local_e8);
    Var::Var(&local_c8,0xffffffff,&local_e8);
    bVar1 = ParseVarOpt(this,(Var *)local_60,&local_c8);
    Var::~Var(&local_c8);
    if (!bVar1) break;
    std::vector<wabt::ElemExpr,std::allocator<wabt::ElemExpr>>::emplace_back<wabt::Var&>
              ((vector<wabt::ElemExpr,std::allocator<wabt::ElemExpr>> *)var.field_2._24_8_,
               (Var *)local_60);
  }
  bVar1 = std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::empty
                    ((vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_> *)var.field_2._24_8_);
  Var::~Var((Var *)local_60);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool WastParser::ParseElemExprVarListOpt(ElemExprVector* out_list) {
  WABT_TRACE(ParseElemExprVarListOpt);
  Var var;
  while (ParseVarOpt(&var)) {
    out_list->emplace_back(var);
  }
  return !out_list->empty();
}